

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::parseURL(Token *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  TokenizerException *this_00;
  tokenValue local_e8;
  undefined1 local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  regex url_regex;
  Token local_68;
  undefined1 local_38 [8];
  string url;
  Tokenizer *this_local;
  
  url.field_2._8_8_ = this;
  parseString(&local_68,this,'`');
  pbVar2 = std::get<std::__cxx11::string,int,double,std::__cxx11::string,bool,char>(&local_68.value)
  ;
  std::__cxx11::string::string((string *)local_38,(string *)pbVar2);
  Token::~Token(&local_68);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_98,
             "^(https?:\\/\\/)?([\\da-z\\.-]+)\\.([a-z\\.]{2,6})([\\/\\w \\.-]*)*\\/?$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_98,0);
  if (!bVar1) {
    local_b9 = 1;
    this_00 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b8,"Malformed URL: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    TokenizerException::TokenizerException
              (this_00,&local_b8,this->line_number,this->col_number,&this->current_line);
    local_b9 = 0;
    __cxa_throw(this_00,&TokenizerException::typeinfo,TokenizerException::~TokenizerException);
  }
  std::variant<int,double,std::__cxx11::string,bool,char>::
  variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
            ((variant<int,double,std::__cxx11::string,bool,char> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  Token::Token(__return_storage_ptr__,String,&local_e8);
  std::
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~variant(&local_e8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_98);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseURL() {
    string url = get<string>(parseString('`').value);
    regex url_regex = std::regex(R"(^(https?:\/\/)?([\da-z\.-]+)\.([a-z\.]{2,6})([\/\w \.-]*)*\/?$)");
    if (!regex_match(url, url_regex)) {
        throw TokenizerException("Malformed URL: " + url, line_number, col_number, current_line);
    } else {
        // TODO: Possibly add a Url token?
        return Token(String, url);
    }
}